

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O2

void deq(Block *b,ProxyWithLink *cp)

{
  Link *pLVar1;
  pointer pBVar2;
  undefined8 in_RAX;
  MemoryBuffer *pMVar3;
  mapped_type *pmVar4;
  long lVar5;
  int i;
  long lVar6;
  undefined8 local_38;
  
  pLVar1 = cp->link_;
  lVar5 = 0;
  local_38 = in_RAX;
  for (lVar6 = 0;
      pBVar2 = (pLVar1->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_start,
      lVar6 < (int)((ulong)((long)(pLVar1->neighbors_).
                                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) >> 3);
      lVar6 = lVar6 + 1) {
    pMVar3 = diy::Master::Proxy::incoming(&cp->super_Proxy,*(int *)((long)&pBVar2->gid + lVar5));
    if ((pMVar3->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pMVar3->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_38._4_4_ =
           *(undefined4 *)
            ((long)&((cp->link_->neighbors_).
                     super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                     super__Vector_impl_data._M_start)->gid + lVar5);
      pmVar4 = std::
               map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
               ::operator[](&(cp->super_Proxy).incoming_,(key_type *)((long)&local_38 + 4));
      (*(pmVar4->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar4,b,4);
      local_38 = CONCAT44(local_38._4_4_,(cp->super_Proxy).gid_);
      fmt::v7::print<char[52],int,int&,int&,char>
                (_stderr,(char (*) [52])"Dequeue: gid {} received value {} from link gid {}\n",
                 (int *)&local_38,&b->count,
                 (int *)((long)&((pLVar1->neighbors_).
                                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->gid + lVar5));
      b->count = b->count + 1;
    }
    lVar5 = lVar5 + 8;
  }
  return;
}

Assistant:

void deq(Block* b, const diy::Master::ProxyWithLink& cp)
{
    diy::Link* l = cp.link();

    for (int i = 0; i < l->size(); ++i)
    {
        int gid = l->target(i).gid;
        if (cp.incoming(gid).size())
        {
            cp.dequeue(cp.link()->target(i).gid, b->count);
            fmt::print(stderr, "Dequeue: gid {} received value {} from link gid {}\n",
                    cp.gid(), b->count, l->target(i).gid);
            b->count++;
        }
    }
}